

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int luaK_exp2RK(FuncState *fs,expdesc *e)

{
  Value VVar1;
  lua_State *plVar2;
  uint uVar3;
  int b;
  char *__assertion;
  TValue k;
  TValue local_20;
  
  luaK_exp2val(fs,e);
  switch(e->k) {
  case VNIL:
    local_20.tt_ = 0;
    VVar1 = (Value)fs->ls->h;
    if (9 < ((VVar1.gc)->tt & 0xe)) {
      __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
LAB_00140ece:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x205,"int nilK(FuncState *)");
    }
    k.tt_ = 0x8005;
    k.value_ = VVar1;
    if (((VVar1.gc)->tt != 5) ||
       ((plVar2 = fs->ls->L, plVar2 != (lua_State *)0x0 &&
        (((VVar1.gc)->marked & (plVar2->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assertion = "0";
      goto LAB_00140ece;
    }
    uVar3 = addk(fs,&k,&local_20);
    break;
  case VTRUE:
    b = 1;
    goto LAB_00140e83;
  case VFALSE:
    b = 0;
LAB_00140e83:
    uVar3 = boolK(fs,b);
    break;
  case VK:
    uVar3 = (e->u).info;
    goto LAB_00140e99;
  case VKFLT:
    uVar3 = luaK_numberK(fs,(e->u).nval);
    break;
  case VKINT:
    uVar3 = luaK_intK(fs,(e->u).ival);
    break;
  default:
    goto switchD_00140dfe_default;
  }
  (e->u).info = uVar3;
LAB_00140e99:
  e->k = VK;
  if ((int)uVar3 < 0x80) {
    uVar3 = uVar3 | 0x80;
  }
  else {
switchD_00140dfe_default:
    uVar3 = luaK_exp2anyreg(fs,e);
  }
  return uVar3;
}

Assistant:

int luaK_exp2RK (FuncState *fs, expdesc *e) {
  luaK_exp2val(fs, e);
  switch (e->k) {  /* move constants to 'k' */
    case VTRUE: e->u.info = boolK(fs, 1); goto vk;
    case VFALSE: e->u.info = boolK(fs, 0); goto vk;
    case VNIL: e->u.info = nilK(fs); goto vk;
    case VKINT: e->u.info = luaK_intK(fs, e->u.ival); goto vk;
    case VKFLT: e->u.info = luaK_numberK(fs, e->u.nval); goto vk;
    case VK:
     vk:
      e->k = VK;
      if (e->u.info <= MAXINDEXRK)  /* constant fits in 'argC'? */
        return RKASK(e->u.info);
      else break;
    default: break;
  }
  /* not a constant in the right range: put it in a register */
  return luaK_exp2anyreg(fs, e);
}